

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O1

void __thiscall SocketLog::disconnectAllStreams(SocketLog *this)

{
  pointer ppTVar1;
  TCPStream *this_00;
  void *__buf;
  int iVar2;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  int in_R8D;
  pointer ppTVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->streamMutex);
  if (iVar2 == 0) {
    ppTVar1 = (this->connectedStreams).super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __buf = extraout_RDX;
    for (ppTVar3 = (this->connectedStreams).
                   super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppTVar3 != ppTVar1; ppTVar3 = ppTVar3 + 1) {
      this_00 = *ppTVar3;
      TCPStream::send(this_00,0x105154,__buf,in_RCX,in_R8D);
      TCPStream::~TCPStream(this_00);
      operator_delete(this_00);
      __buf = extraout_RDX_00;
    }
    ppTVar3 = (this->connectedStreams).super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->connectedStreams).super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppTVar3) {
      (this->connectedStreams).super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>._M_impl
      .super__Vector_impl_data._M_finish = ppTVar3;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->streamMutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void SocketLog::disconnectAllStreams() {
    std::lock_guard<std::mutex> lockStream(streamMutex);

    for(auto stream:connectedStreams) {
        stream->send("SocketLog say Bye!\n");
        delete stream;
    }
    connectedStreams.clear();
}